

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

bool google::protobuf::io::ReadHexDigits(char *ptr,int len,uint32 *result)

{
  int iVar1;
  int iVar2;
  int *in_RDX;
  int in_ESI;
  char *in_RDI;
  char *end;
  char *local_10;
  bool local_1;
  
  *in_RDX = 0;
  if (in_ESI == 0) {
    local_1 = false;
  }
  else {
    for (local_10 = in_RDI; local_10 < in_RDI + in_ESI; local_10 = local_10 + 1) {
      if (*local_10 == '\0') {
        return false;
      }
      iVar1 = *in_RDX;
      iVar2 = anon_unknown_4::DigitValue(*local_10);
      *in_RDX = iVar1 * 0x10 + iVar2;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool ReadHexDigits(const char* ptr, int len, uint32* result) {
  *result = 0;
  if (len == 0) return false;
  for (const char* end = ptr + len; ptr < end; ++ptr) {
    if (*ptr == '\0') return false;
    *result = (*result << 4) + DigitValue(*ptr);
  }
  return true;
}